

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

int aom_vector_push_back(Vector *vector,void *element)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  void *__src;
  void *__dest;
  size_t sVar4;
  
  uVar2 = vector->size;
  if (uVar2 == vector->capacity) {
    lVar1 = uVar2 * 2;
    sVar4 = lVar1 + (ulong)(lVar1 == 0);
    if ((lVar1 != 0) || (sVar4 = 2, 2 < vector->capacity)) {
      sVar3 = vector->element_size;
      __src = vector->data;
      __dest = malloc(sVar3 * sVar4);
      vector->data = __dest;
      if (__dest == (void *)0x0) {
        return -1;
      }
      memcpy(__dest,__src,sVar3 * uVar2);
      vector->capacity = sVar4;
      free(__src);
    }
  }
  memcpy((void *)(vector->size * vector->element_size + (long)vector->data),element,
         vector->element_size);
  vector->size = vector->size + 1;
  return 0;
}

Assistant:

int aom_vector_push_back(Vector *vector, void *element) {
  assert(vector != NULL);
  assert(element != NULL);

  if (_vector_should_grow(vector)) {
    if (_vector_adjust_capacity(vector) == VECTOR_ERROR) {
      return VECTOR_ERROR;
    }
  }

  _vector_assign(vector, vector->size, element);

  ++vector->size;

  return VECTOR_SUCCESS;
}